

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::setFilterOnWrite(QPDFObjectHandle *this,bool val)

{
  QPDFObjectHandle local_20;
  
  as_stream(&local_20,(typed)this);
  ::qpdf::Stream::setFilterOnWrite((Stream *)&local_20,val);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFObjectHandle::setFilterOnWrite(bool val)
{
    as_stream(error).setFilterOnWrite(val);
}